

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void pushclosure(lua_State *L,Proto *p,UpVal **encup,StkId base,StkId ra)

{
  uint n;
  Upvaldesc *pUVar1;
  LClosure *pLVar2;
  UpVal *pUVar3;
  lu_byte *plVar4;
  char *__assertion;
  ulong uVar5;
  
  n = p->sizeupvalues;
  pUVar1 = p->upvalues;
  pLVar2 = luaF_newLclosure(L,n);
  pLVar2->p = p;
  if ((pLVar2->tt & 0xe) < 10) {
    (ra->value_).gc = (GCObject *)pLVar2;
    ra->tt_ = 0x8006;
    if ((pLVar2->tt == '\x06') &&
       ((L == (lua_State *)0x0 || ((pLVar2->marked & (L->l_G->currentwhite ^ 0x18)) == 0)))) {
      plVar4 = &pUVar1->idx;
      for (uVar5 = 0; (~((int)n >> 0x1f) & n) != uVar5; uVar5 = uVar5 + 1) {
        if (plVar4[-1] == 0) {
          pUVar3 = encup[*plVar4];
        }
        else {
          pUVar3 = luaF_findupval(L,base + *plVar4);
        }
        pLVar2->upvals[uVar5] = pUVar3;
        pUVar3->refcount = pUVar3->refcount + 1;
        plVar4 = plVar4 + 0x18;
      }
      if ((p->marked & 0x20) == 0) {
        p->cache = pLVar2;
      }
      return;
    }
    __assertion = "0";
  }
  else {
    __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0x3da,"void pushclosure(lua_State *, Proto *, UpVal **, StkId, StkId)");
}

Assistant:

static void pushclosure (lua_State *L, Proto *p, UpVal **encup, StkId base,
                         StkId ra) {
  int nup = p->sizeupvalues;
  Upvaldesc *uv = p->upvalues;
  int i;
  LClosure *ncl = luaF_newLclosure(L, nup);
  ncl->p = p;
  setclLvalue(L, ra, ncl);  /* anchor new closure in stack */
  for (i = 0; i < nup; i++) {  /* fill in its upvalues */
    if (uv[i].instack)  /* upvalue refers to local variable? */
      ncl->upvals[i] = luaF_findupval(L, base + uv[i].idx);
    else  /* get upvalue from enclosing function */
      ncl->upvals[i] = encup[uv[i].idx];
    ncl->upvals[i]->refcount++;
    /* new closure is white, so we do not need a barrier here */
  }
  if (!isblack(p))  /* cache will not break GC invariant? */
    p->cache = ncl;  /* save it on cache for reuse */
}